

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void Lib::List<Inferences::ALASCA::SuperpositionConf::Rhs>::push
               (Rhs *elem,List<Inferences::ALASCA::SuperpositionConf::Rhs> **lst)

{
  Clause *pCVar1;
  Rhs *in_RSI;
  Rhs *in_stack_ffffffffffffff90;
  List<Inferences::ALASCA::SuperpositionConf::Rhs> *in_stack_ffffffffffffffe8;
  
  Inferences::ALASCA::SuperpositionConf::Rhs::Rhs
            (in_stack_ffffffffffffff90,(Rhs *)&stack0xffffffffffffffa8);
  pCVar1 = (Clause *)cons(in_RSI,in_stack_ffffffffffffffe8);
  (in_RSI->super_SelectedLiteral).cl = pCVar1;
  Inferences::ALASCA::SuperpositionConf::Rhs::~Rhs((Rhs *)0x4bb221);
  return;
}

Assistant:

static void push(C elem,List* &lst)
  {
    lst = cons(elem, lst);
  }